

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocketabstraction_p.h
# Opt level: O0

void QSocketAbstraction::visit<QHttpNetworkConnectionChannel::init()::__0>
               (anon_class_8_1_8991fb9c *fn,QIODevice *socket)

{
  QAbstractSocket *pQVar1;
  QLocalSocket *pQVar2;
  QLocalSocket *s_1;
  QAbstractSocket *s;
  QAbstractSocket *in_stack_00000028;
  QLocalSocket *in_stack_00000030;
  anon_class_8_1_8991fb9c *in_stack_00000038;
  
  pQVar1 = qobject_cast<QAbstractSocket*>((QObject *)0x2f82f8);
  if (pQVar1 == (QAbstractSocket *)0x0) {
    pQVar2 = qobject_cast<QLocalSocket*>((QObject *)0x2f8320);
    if (pQVar2 != (QLocalSocket *)0x0) {
      QHttpNetworkConnectionChannel::init()::$_0::operator()(in_stack_00000038,in_stack_00000030);
    }
  }
  else {
    QHttpNetworkConnectionChannel::init()::$_0::operator()
              ((anon_class_8_1_8991fb9c *)in_stack_00000030,in_stack_00000028);
  }
  return;
}

Assistant:

auto visit(Fn &&fn, QIODevice *socket, Args &&...args)
{
    if (auto *s = qobject_cast<QAbstractSocket *>(socket))
        return std::forward<Fn>(fn)(s, std::forward<Args>(args)...);
#if QT_CONFIG(localserver)
    if (auto *s = qobject_cast<QLocalSocket *>(socket))
        return std::forward<Fn>(fn)(s, std::forward<Args>(args)...);
#endif
    Q_UNREACHABLE();
}